

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON::IsDirectory(wchar_t *pathname)

{
  int iVar1;
  char *utf8pathname_00;
  char *utf8pathname;
  ON_String s;
  wchar_t local_30 [2];
  wchar_t trim [2];
  wchar_t *stail;
  ON_wString buffer;
  wchar_t *pwStack_10;
  bool rc;
  wchar_t *pathname_local;
  
  buffer.m_s._7_1_ = 0;
  if ((pathname != (wchar_t *)0x0) && (*pathname != L'\0')) {
    ON_wString::ON_wString((ON_wString *)&stail);
    for (trim = (wchar_t  [2])pathname; *(int *)trim != 0; trim = (wchar_t  [2])((long)trim + 4)) {
    }
    trim = (wchar_t  [2])((long)trim + -4);
    pwStack_10 = pathname;
    if ((*(int *)trim == 0x5c) || (*(int *)trim == 0x2f)) {
      local_30[0] = *(wchar_t *)trim;
      local_30[1] = 0;
      ON_wString::operator=((ON_wString *)&stail,pathname);
      ON_wString::TrimRight((ON_wString *)&stail,local_30);
      iVar1 = ON_wString::Length((ON_wString *)&stail);
      if (0 < iVar1) {
        pwStack_10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stail);
      }
    }
    ON_String::ON_String((ON_String *)&utf8pathname,pwStack_10);
    utf8pathname_00 = ON_String::operator_cast_to_char_((ON_String *)&utf8pathname);
    buffer.m_s._7_1_ = IsDirectory(utf8pathname_00);
    ON_String::~ON_String((ON_String *)&utf8pathname);
    ON_wString::~ON_wString((ON_wString *)&stail);
  }
  return (bool)(buffer.m_s._7_1_ & 1);
}

Assistant:

bool ON::IsDirectory( const wchar_t* pathname )
{
  bool rc = false;

  if ( 0 != pathname && 0 != pathname[0] )
  {
    ON_wString buffer;
    const wchar_t* stail = pathname;
    while ( 0 != *stail )
      stail++;
    stail--;
    if ( '\\' == *stail || '/' == *stail ) 
    {
      const wchar_t trim[2] = {*stail,0};
      buffer = pathname;
      buffer.TrimRight(trim);
      if ( buffer.Length() > 0 )
        pathname = static_cast< const wchar_t* >(buffer);
    }
#if defined(ON_COMPILER_MSC)
    // this works on Windows
    struct _stat64 buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = _wstat64( pathname, &buf );
    if ( 0 == stat_errno && 0 != (_S_IFDIR & buf.st_mode) )
    {
      rc = true;
    }
#else
    ON_String s = pathname;
    const char* utf8pathname = s;
    rc = ON::IsDirectory(utf8pathname);
#endif
  }

  return rc;
}